

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O0

double units::quick_convert<units::precise_unit,units::precise_unit>
                 (double val,precise_unit *start,precise_unit *result)

{
  bool bVar1;
  unit_data uVar2;
  unit_data uVar3;
  precise_unit *in_RSI;
  precise_unit *in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  unit_data *in_stack_ffffffffffffffd8;
  double dVar5;
  
  uVar2 = precise_unit::base_units(in_RDI);
  uVar3 = precise_unit::base_units(in_RSI);
  bVar1 = detail::unit_data::operator==
                    ((unit_data *)CONCAT44(uVar2,uVar3),in_stack_ffffffffffffffd8);
  if (((!bVar1) || (bVar1 = precise_unit::is_equation((precise_unit *)0x4e44ef), bVar1)) ||
     (bVar1 = precise_unit::is_equation((precise_unit *)0x4e44fd), bVar1)) {
    dVar5 = NAN;
  }
  else {
    dVar4 = precise_unit::multiplier(in_RDI);
    dVar5 = precise_unit::multiplier(in_RSI);
    dVar5 = (in_XMM0_Qa * dVar4) / dVar5;
  }
  return dVar5;
}

Assistant:

constexpr double quick_convert(double val, const UX& start, const UX2& result)
{
    static_assert(
        std::is_same<UX, unit>::value || std::is_same<UX, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    static_assert(
        std::is_same<UX2, unit>::value ||
            std::is_same<UX2, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    return (start.base_units() == result.base_units() && !start.is_equation() &&
            !result.is_equation()) ?
        val * start.multiplier() / result.multiplier() :
        constants::invalid_conversion;
}